

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableRenderTest::genVertexAttribData
          (BuiltinVariableRenderTest *this)

{
  reference pvVar1;
  reference pvVar2;
  Vector<float,_4> local_90;
  Vector<float,_4> local_80;
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  Vector<float,_4> local_30;
  Vector<float,_4> local_20;
  BuiltinVariableRenderTest *local_10;
  BuiltinVariableRenderTest *this_local;
  
  local_10 = this;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexPosData,4);
  tcu::Vector<float,_4>::Vector(&local_20,0.5,0.0,0.0,1.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexPosData,0);
  *(undefined8 *)pvVar1->m_data = local_20.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_20.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_30,0.0,0.5,0.0,1.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexPosData,1);
  *(undefined8 *)pvVar1->m_data = local_30.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_30.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_40,-0.7,-0.1,0.0,1.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexPosData,2);
  *(undefined8 *)pvVar1->m_data = local_40.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_40.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_50,-0.1,-0.7,0.0,1.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexPosData,3);
  *(undefined8 *)pvVar1->m_data = local_50.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_50.m_data._8_8_;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,4);
  tcu::Vector<float,_4>::Vector(&local_60,0.0,0.0,0.0,0.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,0);
  *(undefined8 *)pvVar1->m_data = local_60.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_60.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_70,1.0,0.0,0.0,0.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,1);
  *(undefined8 *)pvVar1->m_data = local_70.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_70.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_80,2.0,0.0,0.0,0.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,2);
  *(undefined8 *)pvVar1->m_data = local_80.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_80.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_90,3.0,0.0,0.0,0.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,3);
  *(undefined8 *)pvVar1->m_data = local_90.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_90.m_data._8_8_;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_indices,4);
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_indices,0);
  *pvVar2 = 3;
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_indices,1);
  *pvVar2 = 2;
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_indices,2);
  *pvVar2 = 0xffff;
  pvVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_indices,3);
  *pvVar2 = 1;
  (this->super_GeometryShaderRenderTest).m_numDrawVertices = 4;
  return;
}

Assistant:

void BuiltinVariableRenderTest::genVertexAttribData (void)
{
	m_vertexPosData.resize(4);
	m_vertexPosData[0] = tcu::Vec4( 0.5f,  0.0f, 0.0f, 1.0f);
	m_vertexPosData[1] = tcu::Vec4( 0.0f,  0.5f, 0.0f, 1.0f);
	m_vertexPosData[2] = tcu::Vec4(-0.7f, -0.1f, 0.0f, 1.0f);
	m_vertexPosData[3] = tcu::Vec4(-0.1f, -0.7f, 0.0f, 1.0f);

	m_vertexAttrData.resize(4);
	m_vertexAttrData[0] = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	m_vertexAttrData[1] = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);
	m_vertexAttrData[2] = tcu::Vec4(2.0f, 0.0f, 0.0f, 0.0f);
	m_vertexAttrData[3] = tcu::Vec4(3.0f, 0.0f, 0.0f, 0.0f);

	// Only used by primitive ID restart test
	m_indices.resize(4);
	m_indices[0] = 3;
	m_indices[1] = 2;
	m_indices[2] = 0xFFFF; // restart
	m_indices[3] = 1;

	m_numDrawVertices = 4;
}